

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O2

int OpenMD::lexi_cast<int>(string *str)

{
  long *plVar1;
  ostream *poVar2;
  int result;
  istringstream iss;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)str,_S_in);
  plVar1 = (long *)std::istream::operator>>((istringstream *)&iss,&result);
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"lexi_cast Error");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  return result;
}

Assistant:

T lexi_cast(const std::string& str) {
    T result;
    std::istringstream iss(str);
    if (!(iss >> result)) { std::cerr << "lexi_cast Error" << std::endl; }
    return result;
  }